

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3ValueBytes(sqlite3_value *pVal,u8 enc)

{
  ushort uVar1;
  int iVar2;
  void *pvVar3;
  
  uVar1 = pVal->flags;
  if ((uVar1 & 0x10) == 0) {
    pvVar3 = sqlite3ValueText(pVal,enc);
    if (pvVar3 == (void *)0x0) {
      return 0;
    }
    uVar1 = pVal->flags;
  }
  iVar2 = pVal->n;
  if ((uVar1 >> 0xe & 1) != 0) {
    iVar2 = iVar2 + (pVal->u).nZero;
  }
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3ValueBytes(sqlite3_value *pVal, u8 enc){
  Mem *p = (Mem*)pVal;
  if( (p->flags & MEM_Blob)!=0 || sqlite3ValueText(pVal, enc) ){
    if( p->flags & MEM_Zero ){
      return p->n + p->u.nZero;
    }else{
      return p->n;
    }
  }
  return 0;
}